

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cExplicitUniformLocationTest.cpp
# Opt level: O2

void __thiscall
glcts::anon_unknown_0::ExplicitUniformLocationCaseBase::setUniform
          (ExplicitUniformLocationCaseBase *this,Uniform *uniform,CompiledProgram *program)

{
  UniformValue *this_00;
  int location;
  CallLogWrapper *this_01;
  GLuint program_00;
  GLenum GVar1;
  pointer puVar2;
  pointer pUVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  GLfloat *pGVar7;
  GLint *pGVar8;
  GLuint *pGVar9;
  size_t i;
  ulong uVar10;
  long lVar11;
  size_t j;
  int arrayElement;
  byte bVar12;
  GLchar *local_1e0 [4];
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_1c0;
  ostringstream name;
  
  bVar12 = 0;
  for (uVar10 = 0;
      puVar2 = (program->stages).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start,
      uVar10 < (ulong)((long)(program->stages).
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_finish - (long)puVar2 >> 2);
      uVar10 = uVar10 + 1) {
    bVar4 = DefOccurence::occurs(&uniform->declOccurence,puVar2[uVar10]);
    bVar5 = false;
    if (bVar4) {
      bVar5 = DefOccurence::occurs
                        (&uniform->usageOccurence,
                         (program->stages).
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_start[uVar10]);
    }
    bVar12 = bVar12 | bVar5;
  }
  if (bVar12 != 0) {
    if ((uniform->type).baseType == 0) {
      lVar11 = 0;
      for (uVar10 = 0;
          pUVar3 = (uniform->childUniforms).
                   super__Vector_base<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
                   ._M_impl.super__Vector_impl_data._M_start,
          uVar10 < (ulong)(((long)(uniform->childUniforms).
                                  super__Vector_base<glcts::(anonymous_namespace)::Uniform,_std::allocator<glcts::(anonymous_namespace)::Uniform>_>
                                  ._M_impl.super__Vector_impl_data._M_finish - (long)pUVar3) / 0x1d8
                          ); uVar10 = uVar10 + 1) {
        setUniform(this,(Uniform *)((long)&(pUVar3->type).enumType + lVar11),program);
        lVar11 = lVar11 + 0x1d8;
      }
    }
    else {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_1c0,&program->stages)
      ;
      bVar4 = LayoutSpecifierBase::isImplicit
                        (&(uniform->location).super_LayoutSpecifierBase,
                         (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_1c0);
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_1c0);
      if (bVar4) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&name);
        std::operator<<((ostream *)&name,(string *)&uniform->name);
        UniformType::streamArrayStr(&uniform->type,&name,0);
        program_00 = program->name;
        std::__cxx11::stringbuf::str();
        iVar6 = glu::CallLogWrapper::glGetUniformLocation
                          (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,
                           program_00,local_1e0[0]);
        std::__cxx11::string::~string((string *)local_1e0);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&name);
      }
      else {
        iVar6 = (uniform->location).super_LayoutSpecifierBase.val;
      }
      this_01 = &(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper;
      this_00 = &uniform->value;
      for (arrayElement = 0; arrayElement < (uniform->type).arraySize;
          arrayElement = arrayElement + 1) {
        location = iVar6 + arrayElement;
        GVar1 = (uniform->type).enumType;
        switch(GVar1) {
        case 0x8b50:
          pGVar7 = (GLfloat *)UniformValue::getPtr(this_00,arrayElement);
          glu::CallLogWrapper::glUniform2fv(this_01,location,1,pGVar7);
          break;
        case 0x8b51:
          pGVar7 = (GLfloat *)UniformValue::getPtr(this_00,arrayElement);
          glu::CallLogWrapper::glUniform3fv(this_01,location,1,pGVar7);
          break;
        case 0x8b52:
          pGVar7 = (GLfloat *)UniformValue::getPtr(this_00,arrayElement);
          glu::CallLogWrapper::glUniform4fv(this_01,location,1,pGVar7);
          break;
        case 0x8b53:
          pGVar8 = (GLint *)UniformValue::getPtr(this_00,arrayElement);
          glu::CallLogWrapper::glUniform2iv(this_01,location,1,pGVar8);
          break;
        case 0x8b54:
          pGVar8 = (GLint *)UniformValue::getPtr(this_00,arrayElement);
          glu::CallLogWrapper::glUniform3iv(this_01,location,1,pGVar8);
          break;
        case 0x8b55:
          pGVar8 = (GLint *)UniformValue::getPtr(this_00,arrayElement);
          glu::CallLogWrapper::glUniform4iv(this_01,location,1,pGVar8);
          break;
        case 0x8b56:
        case 0x8b57:
        case 0x8b58:
        case 0x8b59:
        case 0x8b5d:
        case 0x8b5f:
        case 0x8b60:
        case 0x8b61:
        case 0x8b62:
        case 0x8b63:
        case 0x8b64:
switchD_00bd9c45_caseD_8b56:
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cExplicitUniformLocationTest.cpp"
                        ,0x5e1,
                        "void glcts::(anonymous namespace)::ExplicitUniformLocationCaseBase::setUniform(const Uniform &, const CompiledProgram &)"
                       );
        case 0x8b5a:
          pGVar7 = (GLfloat *)UniformValue::getPtr(this_00,arrayElement);
          glu::CallLogWrapper::glUniformMatrix2fv(this_01,location,1,'\0',pGVar7);
          break;
        case 0x8b5b:
          pGVar7 = (GLfloat *)UniformValue::getPtr(this_00,arrayElement);
          glu::CallLogWrapper::glUniformMatrix3fv(this_01,location,1,'\0',pGVar7);
          break;
        case 0x8b5c:
          pGVar7 = (GLfloat *)UniformValue::getPtr(this_00,arrayElement);
          glu::CallLogWrapper::glUniformMatrix4fv(this_01,location,1,'\0',pGVar7);
          break;
        case 0x8b5e:
switchD_00bd9c45_caseD_8b5e:
          pGVar8 = (GLint *)UniformValue::getPtr(this_00,arrayElement);
          glu::CallLogWrapper::glUniform1i(this_01,location,*pGVar8);
          break;
        case 0x8b65:
          pGVar7 = (GLfloat *)UniformValue::getPtr(this_00,arrayElement);
          glu::CallLogWrapper::glUniformMatrix2x3fv(this_01,location,1,'\0',pGVar7);
          break;
        case 0x8b66:
          pGVar7 = (GLfloat *)UniformValue::getPtr(this_00,arrayElement);
          glu::CallLogWrapper::glUniformMatrix2x4fv(this_01,location,1,'\0',pGVar7);
          break;
        case 0x8b67:
          pGVar7 = (GLfloat *)UniformValue::getPtr(this_00,arrayElement);
          glu::CallLogWrapper::glUniformMatrix3x2fv(this_01,location,1,'\0',pGVar7);
          break;
        case 0x8b68:
          pGVar7 = (GLfloat *)UniformValue::getPtr(this_00,arrayElement);
          glu::CallLogWrapper::glUniformMatrix3x4fv(this_01,location,1,'\0',pGVar7);
          break;
        case 0x8b69:
          pGVar7 = (GLfloat *)UniformValue::getPtr(this_00,arrayElement);
          glu::CallLogWrapper::glUniformMatrix4x2fv(this_01,location,1,'\0',pGVar7);
          break;
        case 0x8b6a:
          pGVar7 = (GLfloat *)UniformValue::getPtr(this_00,arrayElement);
          glu::CallLogWrapper::glUniformMatrix4x3fv(this_01,location,1,'\0',pGVar7);
          break;
        default:
          if (GVar1 == 0x1404) goto switchD_00bd9c45_caseD_8b5e;
          if (GVar1 == 0x1405) {
            pGVar9 = (GLuint *)UniformValue::getPtr(this_00,arrayElement);
            glu::CallLogWrapper::glUniform1ui(this_01,location,*pGVar9);
          }
          else {
            if (GVar1 != 0x1406) goto switchD_00bd9c45_caseD_8b56;
            pGVar7 = (GLfloat *)UniformValue::getPtr(this_00,arrayElement);
            glu::CallLogWrapper::glUniform1f(this_01,location,*pGVar7);
          }
        }
      }
    }
  }
  return;
}

Assistant:

void setUniform(const Uniform& uniform, const CompiledProgram& program)
	{

		bool used = false;
		for (size_t i = 0; i < program.stages.size(); i++)
		{
			used |= uniform.declOccurence.occurs(program.stages[i]) && uniform.usageOccurence.occurs(program.stages[i]);
		}
		if (!used)
			return;

		if (uniform.type.isStruct())
		{
			for (size_t j = 0; j < uniform.childUniforms.size(); j++)
			{
				setUniform(uniform.childUniforms[j], program);
			}
		}
		else
		{
			GLint loc;
			if (uniform.location.isImplicit(program.stages))
			{
				std::ostringstream name;
				name << uniform.getName();
				uniform.type.streamArrayStr(name, 0);
				loc = glGetUniformLocation(program.name, name.str().c_str());
			}
			else
			{
				loc = uniform.location.val;
			}

			for (int arrayElem = 0; arrayElem < uniform.type.arraySize; arrayElem++)
			{
				switch (uniform.type.enumType)
				{
				case GL_FLOAT:
					glUniform1f(loc, *(GLfloat*)uniform.value.getPtr(arrayElem));
					break;
				case GL_FLOAT_VEC2:
					glUniform2fv(loc, 1, (GLfloat*)uniform.value.getPtr(arrayElem));
					break;
				case GL_FLOAT_VEC3:
					glUniform3fv(loc, 1, (GLfloat*)uniform.value.getPtr(arrayElem));
					break;
				case GL_FLOAT_VEC4:
					glUniform4fv(loc, 1, (GLfloat*)uniform.value.getPtr(arrayElem));
					break;
				case GL_FLOAT_MAT2:
					glUniformMatrix2fv(loc, 1, GL_FALSE, (GLfloat*)uniform.value.getPtr(arrayElem));
					break;
				case GL_FLOAT_MAT3:
					glUniformMatrix3fv(loc, 1, GL_FALSE, (GLfloat*)uniform.value.getPtr(arrayElem));
					break;
				case GL_FLOAT_MAT4:
					glUniformMatrix4fv(loc, 1, GL_FALSE, (GLfloat*)uniform.value.getPtr(arrayElem));
					break;
				case GL_FLOAT_MAT2x3:
					glUniformMatrix2x3fv(loc, 1, GL_FALSE, (GLfloat*)uniform.value.getPtr(arrayElem));
					break;
				case GL_FLOAT_MAT4x3:
					glUniformMatrix4x3fv(loc, 1, GL_FALSE, (GLfloat*)uniform.value.getPtr(arrayElem));
					break;
				case GL_FLOAT_MAT2x4:
					glUniformMatrix2x4fv(loc, 1, GL_FALSE, (GLfloat*)uniform.value.getPtr(arrayElem));
					break;
				case GL_FLOAT_MAT3x4:
					glUniformMatrix3x4fv(loc, 1, GL_FALSE, (GLfloat*)uniform.value.getPtr(arrayElem));
					break;
				case GL_FLOAT_MAT3x2:
					glUniformMatrix3x2fv(loc, 1, GL_FALSE, (GLfloat*)uniform.value.getPtr(arrayElem));
					break;
				case GL_FLOAT_MAT4x2:
					glUniformMatrix4x2fv(loc, 1, GL_FALSE, (GLfloat*)uniform.value.getPtr(arrayElem));
					break;
				case GL_INT:
				case GL_SAMPLER_2D:
					glUniform1i(loc, *(GLint*)uniform.value.getPtr(arrayElem));
					break;
				case GL_INT_VEC2:
					glUniform2iv(loc, 1, (GLint*)uniform.value.getPtr(arrayElem));
					break;
				case GL_INT_VEC3:
					glUniform3iv(loc, 1, (GLint*)uniform.value.getPtr(arrayElem));
					break;
				case GL_INT_VEC4:
					glUniform4iv(loc, 1, (GLint*)uniform.value.getPtr(arrayElem));
					break;
				case GL_UNSIGNED_INT:
					glUniform1ui(loc, *(GLuint*)uniform.value.getPtr(arrayElem));
					break;
				default:
					assert(0);
				}
				loc++;
			}
		}
	}